

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_directory_traversals.c
# Opt level: O0

void test_nodump(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  int iVar6;
  int local_34;
  la_int64_t lStack_30;
  int file_count;
  int64_t offset;
  size_t size;
  void *p;
  archive_entry *ae;
  archive *a;
  
  wVar1 = canNodump();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'ׂ');
    test_skipping("Can\'t test nodump on this filesystem");
  }
  else {
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'׆',"nd",L'ǭ');
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ׇ',"nd/f1",L'Ƥ',L'\xffffffff',"0123456789");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'׈',"nd/f2",L'Ƥ',L'\xffffffff',"hello world");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'׉',"nd/fe",L'Ƥ',L'\xffffffff',(void *)0x0);
    assertion_set_nodump
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'׊',"nd/f2");
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'׋',"nd/f1",0xd8748,0,0xd8748,0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'׌',"nd/f2",0xd8753,0,0xd8753,0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'׍',"nd/fe",0xd8753,0,0xd8753,0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'׎',"nd",0xd875e,0,0xd875e,0);
    p = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'א',(uint)((archive_entry *)p != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    ae = (archive_entry *)archive_read_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'ב',(uint)(ae != (archive_entry *)0x0),
                     "(a = archive_read_disk_new()) != NULL",(void *)0x0);
    failure("Directory traversals should work as well");
    wVar1 = archive_read_disk_open((archive *)ae,"nd");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ח',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"nd\")",ae);
    local_34 = 4;
    while (iVar6 = local_34 + -1, local_34 != 0) {
      archive_entry_clear((archive_entry *)p);
      iVar2 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ל',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",ae);
      pcVar4 = archive_entry_pathname((archive_entry *)p);
      iVar2 = strcmp(pcVar4,"nd");
      if (iVar2 == 0) {
        mVar3 = archive_entry_filetype((archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'מ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                            (void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"nd/f1");
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'נ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                              (void *)0x0);
          lVar5 = archive_entry_size((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ס',lVar5,"archive_entry_size(ae)",10,"10",(void *)0x0);
          iVar2 = archive_read_data_block
                            ((archive *)ae,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffd0
                            );
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ף',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_data_block(a, &p, &size, &offset)",ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'פ',(long)(int)offset,"(int)size",10,"10",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ץ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'צ',(void *)size,"p","0123456789","\"0123456789\"",10,"10",
                              (void *)0x0);
          iVar2 = archive_read_data_block
                            ((archive *)ae,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffd0
                            );
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ר',1,"ARCHIVE_EOF",(long)iVar2,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ש',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ת',(long)(int)lStack_30,"(int)offset",10,"10",(void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar2 = strcmp(pcVar4,"nd/f2");
          if (iVar2 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'׬',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'׭',lVar5,"archive_entry_size(ae)",0xb,"11",(void *)0x0);
            iVar2 = archive_read_data_block
                              ((archive *)ae,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffd0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ׯ',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'װ',(long)(int)offset,"(int)size",0xb,"11",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ױ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ײ',(void *)size,"p","hello world","\"hello world\"",0xb,"11",
                                (void *)0x0);
            iVar2 = archive_read_data_block
                              ((archive *)ae,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffd0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'״',1,"ARCHIVE_EOF",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'׵',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'׶',(long)(int)lStack_30,"(int)offset",0xb,"11",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)p);
            iVar2 = strcmp(pcVar4,"nd/fe");
            if (iVar2 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'׸',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG"
                                  ,(void *)0x0);
              lVar5 = archive_entry_size((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'׹',lVar5,"archive_entry_size(ae)",0,"0",(void *)0x0);
            }
          }
        }
      }
      wVar1 = archive_read_disk_can_descend((archive *)ae);
      local_34 = iVar6;
      if (wVar1 != L'\0') {
        wVar1 = archive_read_disk_descend((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'׾',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_descend(a)",ae);
      }
    }
    failure("There should be no entry");
    iVar6 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'؃',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header2(a, ae)",ae);
    iVar6 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'؆',0,"ARCHIVE_OK",(long)iVar6,"archive_read_close(a)",(void *)0x0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'؋',"nd/f1",0xd8748,0,0xd8748,0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'،',"nd/f2",0xd8753,0,0xd8753,0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'؍',"nd/fe",0xd8753,0,0xd8753,0);
    assertion_utimes("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'؎',"nd",0xd875e,0,0xd875e,0);
    wVar1 = archive_read_disk_set_behavior((archive *)ae,L'\x03');
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ؑ',0,"ARCHIVE_OK",(long)wVar1,
                        "archive_read_disk_set_behavior(a, ARCHIVE_READDISK_RESTORE_ATIME | ARCHIVE_READDISK_HONOR_NODUMP)"
                        ,ae);
    failure("Directory traversals should work as well");
    wVar1 = archive_read_disk_open((archive *)ae,"nd");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ؓ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"nd\")",ae);
    local_34 = 3;
    while (iVar6 = local_34 + -1, local_34 != 0) {
      archive_entry_clear((archive_entry *)p);
      iVar2 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ؘ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",ae);
      failure("File \'nd/f2\' should be exclueded");
      pcVar4 = archive_entry_pathname((archive_entry *)p);
      iVar2 = strcmp(pcVar4,"nd/f2");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ؚ',(uint)(iVar2 != 0),
                       "strcmp(archive_entry_pathname(ae), \"nd/f2\") != 0",(void *)0x0);
      pcVar4 = archive_entry_pathname((archive_entry *)p);
      iVar2 = strcmp(pcVar4,"nd");
      if (iVar2 == 0) {
        mVar3 = archive_entry_filetype((archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'\x061c',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                            (void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"nd/f1");
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'؞',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                              (void *)0x0);
          lVar5 = archive_entry_size((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'؟',lVar5,"archive_entry_size(ae)",10,"10",(void *)0x0);
          iVar2 = archive_read_data_block
                            ((archive *)ae,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffd0
                            );
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ء',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_data_block(a, &p, &size, &offset)",ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'آ',(long)(int)offset,"(int)size",10,"10",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'أ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ؤ',(void *)size,"p","0123456789","\"0123456789\"",10,"10",
                              (void *)0x0);
          iVar2 = archive_read_data_block
                            ((archive *)ae,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffd0
                            );
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ئ',1,"ARCHIVE_EOF",(long)iVar2,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ا',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ب',(long)(int)lStack_30,"(int)offset",10,"10",(void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar2 = strcmp(pcVar4,"nd/fe");
          if (iVar2 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ت',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ث',lVar5,"archive_entry_size(ae)",0,"0",(void *)0x0);
          }
        }
      }
      wVar1 = archive_read_disk_can_descend((archive *)ae);
      local_34 = iVar6;
      if (wVar1 != L'\0') {
        wVar1 = archive_read_disk_descend((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'ذ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_descend(a)",ae);
      }
    }
    failure("There should be no entry");
    iVar6 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ص',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header2(a, ae)",ae);
    failure("Atime should be restored");
    assertion_file_atime
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ظ',"nd/f2",0xd8753,0);
    iVar6 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ػ',0,"ARCHIVE_OK",(long)iVar6,"archive_read_free(a)",(void *)0x0);
    archive_entry_free((archive_entry *)p);
  }
  return;
}

Assistant:

static void
test_nodump(void)
{
	struct archive *a;
	struct archive_entry *ae;
	const void *p;
	size_t size;
	int64_t offset;
	int file_count;

	if (!canNodump()) {
		skipping("Can't test nodump on this filesystem");
		return;
	}

	assertMakeDir("nd", 0755);
	assertMakeFile("nd/f1", 0644, "0123456789");
	assertMakeFile("nd/f2", 0644, "hello world");
	assertMakeFile("nd/fe", 0644, NULL);
	assertSetNodump("nd/f2");
	assertUtimes("nd/f1", 886600, 0, 886600, 0);
	assertUtimes("nd/f2", 886611, 0, 886611, 0);
	assertUtimes("nd/fe", 886611, 0, 886611, 0);
	assertUtimes("nd", 886622, 0, 886622, 0);

	assert((ae = archive_entry_new()) != NULL);
	assert((a = archive_read_disk_new()) != NULL);

	/*
	 * Test1: Traversals without ARCHIVE_READDISK_HONOR_NODUMP
	 */
	failure("Directory traversals should work as well");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "nd"));

	file_count = 4;
	while (file_count--) {
		archive_entry_clear(ae);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae), "nd") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "nd/f1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
		} else if (strcmp(archive_entry_pathname(ae), "nd/f2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 11);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 11);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "hello world", 11);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 11);
		} else if (strcmp(archive_entry_pathname(ae), "nd/fe") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 0);
		}
		if (archive_read_disk_can_descend(a)) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	failure("There should be no entry");
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test2: Traversals with ARCHIVE_READDISK_HONOR_NODUMP
	 */
	assertUtimes("nd/f1", 886600, 0, 886600, 0);
	assertUtimes("nd/f2", 886611, 0, 886611, 0);
	assertUtimes("nd/fe", 886611, 0, 886611, 0);
	assertUtimes("nd", 886622, 0, 886622, 0);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_set_behavior(a,
		ARCHIVE_READDISK_RESTORE_ATIME | ARCHIVE_READDISK_HONOR_NODUMP));
	failure("Directory traversals should work as well");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "nd"));

	file_count = 3;
	while (file_count--) {
		archive_entry_clear(ae);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		failure("File 'nd/f2' should be exclueded");
		assert(strcmp(archive_entry_pathname(ae), "nd/f2") != 0);
		if (strcmp(archive_entry_pathname(ae), "nd") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "nd/f1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
		} else if (strcmp(archive_entry_pathname(ae), "nd/fe") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 0);
		}
		if (archive_read_disk_can_descend(a)) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	failure("There should be no entry");
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	failure("Atime should be restored");
	assertFileAtime("nd/f2", 886611, 0);

	/* Destroy the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	archive_entry_free(ae);
}